

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall
sqvector<SQVM::CallInfo>::resize
          (sqvector<SQVM::CallInfo> *this,SQUnsignedInteger newsize,CallInfo *fill)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  SQGenerator *pSVar4;
  SQInt32 SVar5;
  SQInt32 SVar6;
  undefined4 uVar7;
  SQInt32 SVar8;
  SQInt32 SVar9;
  CallInfo *pCVar10;
  ulong uVar11;
  SQUnsignedInteger SVar12;
  long lVar13;
  
  if (this->_allocated < newsize) {
    pCVar10 = (CallInfo *)sq_vm_realloc(this->_vals,this->_allocated * 0x48,newsize * 0x48);
    this->_vals = pCVar10;
    this->_allocated = newsize;
  }
  uVar11 = this->_size;
  if (uVar11 < newsize) {
    do {
      pCVar10 = this->_vals + uVar11;
      pSVar3 = fill->_literals;
      pCVar10->_ip = fill->_ip;
      pCVar10->_literals = pSVar3;
      SVar2 = (fill->_closure).super_SQObject._type;
      (pCVar10->_closure).super_SQObject._type = SVar2;
      (pCVar10->_closure).super_SQObject._unVal = (fill->_closure).super_SQObject._unVal;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(((pCVar10->_closure).super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pCVar10->_root = fill->_root;
      pSVar4 = fill->_generator;
      SVar8 = fill->_etraps;
      SVar9 = fill->_prevstkbase;
      SVar5 = fill->_target;
      SVar6 = fill->_ncalls;
      uVar7 = *(undefined4 *)&fill->field_0x3c;
      pCVar10->_prevtop = fill->_prevtop;
      pCVar10->_target = SVar5;
      pCVar10->_ncalls = SVar6;
      *(undefined4 *)&pCVar10->field_0x3c = uVar7;
      pCVar10->_generator = pSVar4;
      pCVar10->_etraps = SVar8;
      pCVar10->_prevstkbase = SVar9;
      uVar11 = this->_size + 1;
      this->_size = uVar11;
    } while (uVar11 < newsize);
  }
  else {
    if (newsize < uVar11) {
      lVar13 = newsize * 0x48 + 0x10;
      SVar12 = newsize;
      do {
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&this->_vals->_ip + lVar13));
        SVar12 = SVar12 + 1;
        lVar13 = lVar13 + 0x48;
      } while (SVar12 < this->_size);
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }